

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void __thiscall xmrig::String::String(String *this,char *str)

{
  size_t sVar1;
  char *__dest;
  
  this->m_data = (char *)0x0;
  if (str == (char *)0x0) {
    this->m_size = 0;
  }
  else {
    sVar1 = strlen(str);
    this->m_size = sVar1;
    if (sVar1 != 0) {
      __dest = (char *)operator_new__(sVar1 + 1);
      this->m_data = __dest;
      memcpy(__dest,str,sVar1 + 1);
      return;
    }
  }
  return;
}

Assistant:

xmrig::String::String(const char *str) :
    m_size(str == nullptr ? 0 : strlen(str))
{
    if (m_size == 0) {
        return;
    }

    m_data = new char[m_size + 1];
    memcpy(m_data, str, m_size + 1);
}